

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test2::testBegin
          (GPUShaderFP64Test2 *this,GLuint program_id,shaderStage shader_stage)

{
  code *pcVar1;
  GLenum GVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  reference pvVar7;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar8;
  TestError *pTVar9;
  undefined8 in_stack_fffffffffffffce8;
  undefined4 uVar10;
  int local_1f0;
  GLint location;
  MessageBuilder local_1e8;
  char local_68 [8];
  GLchar name [16];
  GLenum type;
  GLsizei size;
  GLuint i;
  Functions *gl;
  undefined1 local_30 [4];
  GLenum captured_primitive;
  vector<int,_std::allocator<int>_> buffer_data;
  shaderStage shader_stage_local;
  GLuint program_id_local;
  GPUShaderFP64Test2 *this_local;
  long lVar6;
  
  buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = shader_stage;
  buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = program_id;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_30);
  GVar2 = getCapturedPrimitiveType
                    (this,(shaderStage)
                          buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_30,0x400);
  for (type = 0; uVar10 = (undefined4)((ulong)in_stack_fffffffffffffce8 >> 0x20), type < 0x400;
      type = type + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(ulong)type);
    *pvVar7 = 2;
  }
  if ((shaderStage)
      buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage == COMPUTE_SHADER) {
    (**(code **)(lVar6 + 0xb8))(0xde1,this->m_texture_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x113d);
    pcVar1 = *(code **)(lVar6 + 0x13b8);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,0);
    (*pcVar1)(0xde1,0,0,0,0x20,0x20,CONCAT44(uVar10,0x8d94),0x1404,pvVar7);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"TexSubImage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1141);
    iVar3 = (**(code **)(lVar6 + 0xb48))
                      (buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_,"result");
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"TexSubImage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1144);
    if (iVar3 == -1) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Inactive uniform \"result\"",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x1148);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lVar6 + 0x14f0))(iVar3,0);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"TexSubImage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x114c);
    (**(code **)(lVar6 + 0x80))(0,this->m_texture_id,0,0,0,0x88b9,0x8235);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1151);
  }
  else if ((shaderStage)
           buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage == FRAGMENT_SHADER) {
    (**(code **)(lVar6 + 0xb8))(0xde1,this->m_texture_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1127);
    pcVar1 = *(code **)(lVar6 + 0x13b8);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,0);
    (*pcVar1)(0xde1,0,0,0,0x20,0x20,CONCAT44(uVar10,0x8d94),0x1404,pvVar7);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"TexSubImage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x112b);
    (**(code **)(lVar6 + 0x78))(0x8ca9,this->m_framebuffer_id);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"BindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x112f);
    (**(code **)(lVar6 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_texture_id,0);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"FramebufferTexture2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1132);
    (**(code **)(lVar6 + 0x1a00))(0,0,0x20);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"Viewport",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1135);
  }
  else if ((shaderStage)
           buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage - GEOMETRY_SHADER < 4) {
    name[0xc] = '\0';
    name[0xd] = '\0';
    name[0xe] = '\0';
    name[0xf] = '\0';
    name[8] = '\0';
    name[9] = '\0';
    name[10] = '\0';
    name[0xb] = '\0';
    (**(code **)(lVar6 + 0xb18))
              (buffer_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,0,0x10,0,name + 0xc,name + 8,local_68
              );
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"GetTransformFeedbackVarying",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1105);
    if ((name._12_4_ == 1) && (name._8_4_ == 0x1404)) {
      iVar3 = strcmp("result",local_68);
      if (iVar3 == 0) {
        (**(code **)(lVar6 + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"BindBuffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1114);
        pcVar1 = *(code **)(lVar6 + 0x150);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,0);
        (*pcVar1)(0x8c8e,0x1000,pvVar7,0x88ea);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"BufferData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x1117);
        (**(code **)(lVar6 + 0x50))(0x8c8e,0,this->m_transform_feedback_buffer_id,0,0x1000);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"BindBufferRange",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x111c);
        (**(code **)(lVar6 + 0x30))(GVar2);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"BeginTransformFeedback",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x111f);
        goto LAB_00f97ac8;
      }
    }
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1e8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (&local_1e8,
                        (char (*) [52])"Error. Invalid GetTransformFeedbackVarying results.");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [8])0x2c6f543);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(int *)(name + 0xc));
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])0x2b48384);
    location = 1;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&location);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])". Type: ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)(name + 8));
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])0x2b48384);
    local_1f0 = 0x1404;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1f0);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])". Name: ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [16])local_68);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])" expected: result");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Invalid GetTransformFeedbackVarying results",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x110e);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
LAB_00f97ac8:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void GPUShaderFP64Test2::testBegin(glw::GLuint program_id, shaderStage shader_stage) const
{
	std::vector<glw::GLint> buffer_data;
	const glw::GLenum		captured_primitive = getCapturedPrimitiveType(shader_stage);
	const glw::Functions&   gl				   = m_context.getRenderContext().getFunctions();

	/* Prepare buffer filled with m_result_failure */
	buffer_data.resize(m_n_captured_results);
	for (glw::GLuint i = 0; i < m_n_captured_results; ++i)
	{
		buffer_data[i] = m_result_failure;
	}

	/* Prepare buffer for test results */
	switch (shader_stage)
	{
	case GEOMETRY_SHADER:
	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
	case VERTEX_SHADER:

		/* Verify getTransformFeedbackVarying results */
		{
			glw::GLsizei size = 0;
			glw::GLenum  type = 0;
			glw::GLchar  name[16];

			gl.getTransformFeedbackVarying(program_id, 0 /* index */, 16 /* bufSize */, 0 /* length */, &size, &type,
										   name);
			GLU_EXPECT_NO_ERROR(gl.getError(), "GetTransformFeedbackVarying");

			if ((1 != size) || (GL_INT != type) || (0 != strcmp("result", name)))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Error. Invalid GetTransformFeedbackVarying results."
					<< " Size: " << size << " expected: " << 1 << ". Type: " << type << " expected: " << GL_INT
					<< ". Name: " << name << " expected: result" << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid GetTransformFeedbackVarying results");
			}
		}

		/* Create/clean transform feedback buffer */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_size, &buffer_data[0], GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

		/* Set up transform feedback buffer */
		gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_transform_feedback_buffer_id, 0 /* offset */,
						   m_transform_feedback_buffer_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

		gl.beginTransformFeedback(captured_primitive);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

		break;

	case FRAGMENT_SHADER:

		/* Clean texture */
		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texSubImage2D(GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, m_texture_width, m_texture_height,
						 GL_RED_INTEGER, GL_INT, &buffer_data[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		/* Set up texture as color attachment 0 */
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_framebuffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture_id, 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

		gl.viewport(0 /* x */, 0 /* y */, m_texture_width, m_texture_height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Viewport");

		break;

	case COMPUTE_SHADER:

		/* Clean texture */
		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texSubImage2D(GL_TEXTURE_2D, 0 /* level */, 0 /* x */, 0 /* y */, m_texture_width, m_texture_height,
						 GL_RED_INTEGER, GL_INT, &buffer_data[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		glw::GLint location = gl.getUniformLocation(program_id, "result");
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		if (-1 == location)
		{
			TCU_FAIL("Inactive uniform \"result\"");
		}

		gl.uniform1i(location, 0 /* first image unit */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		/* Bind texture to first image unit */
		gl.bindImageTexture(0 /* first image unit */, m_texture_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32I);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		break;
	}
}